

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::ShaderSource::ShaderSource
          (ShaderSource *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,char *source,
          bool useSync,bool serverSync)

{
  allocator<char> local_31;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_30;
  
  Operation::Operation(&this->super_Operation,"ShaderSource",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__ShaderSource_01e00588;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_source,source,&local_31);
  local_30.m_ptr = &((this->m_shader).m_ptr)->super_Object;
  local_30.m_state = (this->m_shader).m_state;
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_30.m_state)->strongRefCount = (local_30.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_30.m_state)->weakRefCount = (local_30.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_30);
  ((this->m_shader).m_ptr)->isDefined = true;
  return;
}

Assistant:

ShaderSource::ShaderSource (SharedPtr<Shader> shader, const char* source, bool useSync, bool serverSync)
	: Operation	("ShaderSource", useSync, serverSync)
	, m_shader	(shader)
	, m_source	(source)
{
	modifyGLObject(SharedPtr<Object>(m_shader));
	m_shader->isDefined = true;
}